

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseModuleTypesCtx::addFunc
          (Result<wasm::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *this,Name name,
          vector<wasm::Name,_std::allocator<wasm::Name>_> *param_2,ImportNames *param_3,
          TypeUse *type,
          optional<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_> *locals,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *param_6
          ,Index pos)

{
  uint uVar1;
  pointer puVar2;
  pointer pNVar3;
  char *pcVar4;
  pointer pNVar5;
  bool bVar6;
  size_t sVar7;
  ulong uVar8;
  _Head_base<0UL,_wasm::Function_*,_false> this_00;
  NameType *l;
  pointer pNVar9;
  uint index;
  ulong uVar10;
  Name name_00;
  string local_80;
  Err local_60;
  Result<wasm::Ok> *local_40;
  allocator<char> local_31;
  
  uVar1 = this->index;
  puVar2 = (this->wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar6 = HeapType::isSignature(&type->type);
  if (bVar6) {
    this_00._M_head_impl =
         *(Function **)
          &puVar2[uVar1]._M_t.
           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t;
    *(uintptr_t *)((long)this_00._M_head_impl + 0x38) = (type->type).id;
    index = 0;
    local_40 = __return_storage_ptr__;
    while( true ) {
      uVar10 = (ulong)index;
      uVar8 = (long)(type->names).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(type->names).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 4;
      sVar7 = Function::getNumLocals(this_00._M_head_impl);
      __return_storage_ptr__ = local_40;
      if (sVar7 < uVar8) {
        uVar8 = sVar7;
      }
      if (uVar8 <= uVar10) break;
      pNVar3 = (type->names).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar4 = pNVar3[uVar10].super_IString.str._M_str;
      if (pcVar4 != (char *)0x0) {
        name_00.super_IString.str._M_str = pcVar4;
        name_00.super_IString.str._M_len = pNVar3[uVar10].super_IString.str._M_len;
        Function::setLocalName
                  ((Function *)
                   puVar2[uVar1]._M_t.
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t,
                   index,name_00);
      }
      index = index + 1;
      this_00._M_head_impl =
           *(Function **)
            &puVar2[uVar1]._M_t.
             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t;
    }
    if ((locals->
        super__Optional_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_true,_false,_false>
        .super__Optional_payload_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>
        ._M_engaged != false) {
      pNVar5 = *(pointer *)
                ((long)&(locals->
                        super__Optional_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_false,_false>
                        )._M_payload.
                        super__Optional_payload<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>
                        ._M_payload._M_value.
                        super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl
                + 8);
      for (pNVar9 = *(pointer *)
                     &(locals->
                      super__Optional_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_false,_false>
                      )._M_payload.
                      super__Optional_payload<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>
                      ._M_payload._M_value.
                      super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl;
          pNVar9 != pNVar5; pNVar9 = pNVar9 + 1) {
        Builder::addVar((Builder *)
                        puVar2[uVar1]._M_t.
                        super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                        _M_t,*(Function **)&(pNVar9->name).super_IString,
                        (Name)*(string_view *)((long)&(pNVar9->name).super_IString + 8),
                        (Type)param_2);
      }
    }
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"expected signature type",&local_31);
    Lexer::err(&local_60,&this->in,(ulong)pos,&local_80);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> addFunc(Name name,
                   const std::vector<Name>&,
                   ImportNames*,
                   TypeUse type,
                   std::optional<LocalsT> locals,
                   std::vector<Annotation>&&,
                   Index pos) {
    auto& f = wasm.functions[index];
    if (!type.type.isSignature()) {
      return in.err(pos, "expected signature type");
    }
    f->type = type.type;
    // If we are provided with too many names (more than the function has), we
    // will error on that later when we check the signature matches the type.
    // For now, avoid asserting in setLocalName.
    for (Index i = 0; i < std::min(type.names.size(), f->getNumLocals()); ++i) {
      if (type.names[i].is()) {
        f->setLocalName(i, type.names[i]);
      }
    }
    if (locals) {
      for (auto& l : *locals) {
        Builder::addVar(f.get(), l.name, l.type);
      }
    }
    return Ok{};
  }